

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O0

bool Imf_3_3::anon_unknown_2::isInfinity(float f)

{
  anon_union_4_2_947300a4 u;
  float f_local;
  
  return ABS(f) == INFINITY;
}

Assistant:

inline bool
isInfinity (float f)
{
    union
    {
        float f;
        int   i;
    } u;
    u.f = f;
    return (u.i & 0x7fffffff) == 0x7f800000;
}